

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O1

void __thiscall re2c::Go::~Go(Go *this)

{
  GoBitmap *this_00;
  ulong uVar1;
  
  switch(this->type) {
  case SWITCH_IF:
    this_00 = (GoBitmap *)(this->info).switchif;
    if (this_00 == (GoBitmap *)0x0) {
      return;
    }
    SwitchIf::~SwitchIf((SwitchIf *)this_00);
    break;
  case BITMAP:
    this_00 = (this->info).bitmap;
    if (this_00 == (GoBitmap *)0x0) {
      return;
    }
    GoBitmap::~GoBitmap(this_00);
    uVar1 = 0x20;
    goto LAB_0011f20d;
  case CPGOTO:
    this_00 = (GoBitmap *)(this->info).cpgoto;
    if (this_00 == (GoBitmap *)0x0) {
      return;
    }
    Cpgoto::~Cpgoto((Cpgoto *)this_00);
    break;
  case DOT:
    this_00 = (GoBitmap *)(this->info).dot;
    if (this_00 == (GoBitmap *)0x0) {
      return;
    }
    Dot::~Dot((Dot *)this_00);
    break;
  default:
    return;
  }
  uVar1 = 0x10;
LAB_0011f20d:
  operator_delete(this_00,uVar1);
  return;
}

Assistant:

Go::~Go ()
{
	switch (type)
	{
		case EMPTY:
			break;
		case SWITCH_IF:
			delete info.switchif;
			break;
		case BITMAP:
			delete info.bitmap;
			break;
		case CPGOTO:
			delete info.cpgoto;
			break;
		case DOT:
			delete info.dot;
			break;
	}
}